

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

StringLiteral mp::internal::ExprBase::Create<mp::StringLiteral>(Impl *impl)

{
  BasicExpr<(mp::expr::Kind)70,_(mp::expr::Kind)70> in_RDI;
  StringLiteral expr;
  
  StringLiteral::StringLiteral((StringLiteral *)0x4d3933);
  return (StringLiteral)(Impl *)in_RDI.super_ExprBase.impl_;
}

Assistant:

static TargetExpr Create(const ExprBase::Impl *impl) {
    MP_ASSERT((!impl || internal::Is<TargetExpr>(impl->kind())),
              "invalid expression kind");
    TargetExpr expr;
    expr.impl_ = impl;
    return expr;
  }